

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_combat(parser *p)

{
  void *pvVar1;
  random_conflict rVar2;
  random_conflict rVar3;
  random_conflict rVar4;
  ego_item *e;
  random ta;
  random td;
  random th;
  parser *p_local;
  
  rVar2 = parser_getrand(p,"th");
  rVar3 = parser_getrand(p,"td");
  rVar4 = parser_getrand(p,"ta");
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    td._8_8_ = rVar2._0_8_;
    *(undefined8 *)((long)pvVar1 + 0x208) = td._8_8_;
    th._0_8_ = rVar2._8_8_;
    *(undefined8 *)((long)pvVar1 + 0x210) = th._0_8_;
    ta._8_8_ = rVar3._0_8_;
    *(undefined8 *)((long)pvVar1 + 0x218) = ta._8_8_;
    td._0_8_ = rVar3._8_8_;
    *(undefined8 *)((long)pvVar1 + 0x220) = td._0_8_;
    e = rVar4._0_8_;
    *(ego_item **)((long)pvVar1 + 0x228) = e;
    ta._0_8_ = rVar4._8_8_;
    *(undefined8 *)((long)pvVar1 + 0x230) = ta._0_8_;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_combat(struct parser *p) {
	struct random th = parser_getrand(p, "th");
	struct random td = parser_getrand(p, "td");
	struct random ta = parser_getrand(p, "ta");
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->to_h = th;
	e->to_d = td;
	e->to_a = ta;
	return PARSE_ERROR_NONE;
}